

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O0

void Ssw_ManStop(Ssw_Man_t *p)

{
  Ssw_Man_t *p_local;
  
  if (p->pVisited != (int *)0x0) {
    free(p->pVisited);
    p->pVisited = (int *)0x0;
  }
  if (p->pPars->fVerbose != 0) {
    Ssw_ManPrintStats(p);
  }
  if (p->ppClasses != (Ssw_Cla_t *)0x0) {
    Ssw_ClassesStop(p->ppClasses);
  }
  if (p->pSml != (Ssw_Sml_t *)0x0) {
    Ssw_SmlStop(p->pSml);
  }
  if (p->vDiffPairs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vDiffPairs);
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vInits);
  }
  Vec_PtrFree(p->vResimConsts);
  Vec_PtrFree(p->vResimClasses);
  Vec_PtrFree(p->vNewLos);
  Vec_IntFree(p->vNewPos);
  Vec_PtrFree(p->vCommon);
  if (p->pNodeToFrames != (Aig_Obj_t **)0x0) {
    free(p->pNodeToFrames);
    p->pNodeToFrames = (Aig_Obj_t **)0x0;
  }
  if (p->pPatWords != (uint *)0x0) {
    free(p->pPatWords);
    p->pPatWords = (uint *)0x0;
  }
  if (p != (Ssw_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ssw_ManStop( Ssw_Man_t * p )
{
    ABC_FREE( p->pVisited );
    if ( p->pPars->fVerbose )//&& p->pPars->nStepsMax == -1 )
        Ssw_ManPrintStats( p );
    if ( p->ppClasses )
        Ssw_ClassesStop( p->ppClasses );
    if ( p->pSml )
        Ssw_SmlStop( p->pSml );
    if ( p->vDiffPairs )
        Vec_IntFree( p->vDiffPairs );
    if ( p->vInits )
        Vec_IntFree( p->vInits );
    Vec_PtrFree( p->vResimConsts );
    Vec_PtrFree( p->vResimClasses );
    Vec_PtrFree( p->vNewLos );
    Vec_IntFree( p->vNewPos );
    Vec_PtrFree( p->vCommon );
    ABC_FREE( p->pNodeToFrames );
    ABC_FREE( p->pPatWords );
    ABC_FREE( p );
}